

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O3

bool __thiscall bssl::Vector<TagAndArray>::Push(Vector<TagAndArray> *this,TagAndArray *elem)

{
  undefined8 *puVar1;
  ulong uVar2;
  TagAndArray *pTVar3;
  undefined8 uVar4;
  TagAndArray *pTVar5;
  TagAndArray *pTVar6;
  size_t sVar7;
  long lVar8;
  int line;
  ulong uVar9;
  
  uVar9 = this->size_;
  uVar2 = this->capacity_;
  if (uVar9 < uVar2) {
    pTVar5 = this->data_;
  }
  else {
    if (uVar2 == 0) {
      sVar7 = 0x10;
    }
    else {
      if ((long)uVar2 < 0) {
        line = 0x14d;
LAB_00316590:
        ERR_put_error(0xe,0,0x45,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_internal.h"
                      ,line);
        return false;
      }
      if (uVar2 >> 0x3a != 0) {
        line = 0x153;
        goto LAB_00316590;
      }
      sVar7 = uVar2 * 2;
    }
    pTVar5 = (TagAndArray *)OPENSSL_malloc(sVar7 << 5);
    if (pTVar5 == (TagAndArray *)0x0) {
      return false;
    }
    uVar9 = this->size_;
    if (uVar9 != 0) {
      pTVar3 = this->data_;
      lVar8 = 0;
      do {
        *(undefined8 *)((long)&pTVar5->tag + lVar8) = *(undefined8 *)((long)&pTVar3->tag + lVar8);
        puVar1 = (undefined8 *)((long)&(pTVar5->vec).data_ + lVar8);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&(pTVar5->vec).capacity_ + lVar8) = 0;
        OPENSSL_free((void *)0x0);
        puVar1 = (undefined8 *)((long)&(pTVar5->vec).data_ + lVar8);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        *puVar1 = *(undefined8 *)((long)&(pTVar3->vec).data_ + lVar8);
        *(undefined8 *)((long)&(pTVar3->vec).data_ + lVar8) = 0;
        puVar1[1] = *(undefined8 *)((long)&(pTVar3->vec).size_ + lVar8);
        *(undefined8 *)((long)&(pTVar3->vec).size_ + lVar8) = 0;
        uVar4 = puVar1[2];
        puVar1[2] = *(undefined8 *)((long)&(pTVar3->vec).capacity_ + lVar8);
        *(undefined8 *)((long)&(pTVar3->vec).capacity_ + lVar8) = uVar4;
        pTVar6 = (TagAndArray *)((long)&pTVar3[1].tag + lVar8);
        lVar8 = lVar8 + 0x20;
      } while (pTVar6 != pTVar3 + uVar9);
    }
    clear(this);
    this->data_ = pTVar5;
    this->size_ = uVar9;
    this->capacity_ = sVar7;
  }
  pTVar5[uVar9].tag = elem->tag;
  pTVar5[uVar9].vec.data_ = (unsigned_long *)0x0;
  pTVar5[uVar9].vec.size_ = 0;
  pTVar5[uVar9].vec.capacity_ = 0;
  OPENSSL_free((void *)0x0);
  pTVar5[uVar9].vec.capacity_ = 0;
  pTVar5[uVar9].vec.data_ = (unsigned_long *)0x0;
  pTVar5[uVar9].vec.size_ = 0;
  pTVar5[uVar9].vec.data_ = (elem->vec).data_;
  (elem->vec).data_ = (unsigned_long *)0x0;
  pTVar5[uVar9].vec.size_ = (elem->vec).size_;
  (elem->vec).size_ = 0;
  sVar7 = pTVar5[uVar9].vec.capacity_;
  pTVar5[uVar9].vec.capacity_ = (elem->vec).capacity_;
  (elem->vec).capacity_ = sVar7;
  this->size_ = this->size_ + 1;
  return true;
}

Assistant:

[[nodiscard]] bool Push(T elem) {
    if (!MaybeGrow()) {
      return false;
    }
    new (&data_[size_]) T(std::move(elem));
    size_++;
    return true;
  }